

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void usage(options_description *description)

{
  long *plVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Unpacker for Fallout 1/2 DAT files",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"v0.0.5 (c) 2012-2022 Falltergeist Developers",0x2c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Example: dat-unpacker -f dat1 -s ~/fallout1/master.dat -d ~/unpacked",0x44);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  plVar1 = (long *)boost::program_options::operator<<((ostream *)&std::cout,description);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  return;
}

Assistant:

void usage(const boost::program_options::options_description& description)
{
    std::cout << "Unpacker for Fallout 1/2 DAT files" << std::endl;
    std::cout << "v0.0.5 (c) 2012-2022 Falltergeist Developers" << std::endl;
    std::cout << "Example: dat-unpacker -f dat1 -s ~/fallout1/master.dat -d ~/unpacked" << std::endl;
    std::cout << description << std::endl;
    std::cout << std::endl;
}